

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  ExprList *pEVar1;
  ExprList *pEVar2;
  SrcList *pSVar3;
  Expr *pEVar4;
  With *pWVar5;
  Select *pNew;
  Select *p;
  Select **pp;
  Select *pNext;
  Select *pRet;
  Select *pSStack_18;
  int flags_local;
  Select *pDup_local;
  sqlite3 *db_local;
  
  pNext = (Select *)0x0;
  pp = (Select **)0x0;
  p = (Select *)&pNext;
  pNew = pDup;
  pRet._4_4_ = flags;
  pSStack_18 = pDup;
  pDup_local = (Select *)db;
  while ((pNew != (Select *)0x0 &&
         (pEVar1 = (ExprList *)sqlite3DbMallocRawNN((sqlite3 *)pDup_local,0x70),
         pEVar1 != (ExprList *)0x0))) {
    pEVar2 = sqlite3ExprListDup((sqlite3 *)pDup_local,pNew->pEList,pRet._4_4_);
    *(ExprList **)pEVar1 = pEVar2;
    pSVar3 = sqlite3SrcListDup((sqlite3 *)pDup_local,pNew->pSrc,pRet._4_4_);
    *(SrcList **)&pEVar1->a[0].sortOrder = pSVar3;
    pEVar4 = sqlite3ExprDup((sqlite3 *)pDup_local,pNew->pWhere,pRet._4_4_);
    *(Expr **)(pEVar1 + 1) = pEVar4;
    pEVar4 = (Expr *)sqlite3ExprListDup((sqlite3 *)pDup_local,pNew->pGroupBy,pRet._4_4_);
    pEVar1[1].a[0].pExpr = pEVar4;
    pEVar4 = sqlite3ExprDup((sqlite3 *)pDup_local,pNew->pHaving,pRet._4_4_);
    pEVar1[1].a[0].zName = (char *)pEVar4;
    pEVar2 = sqlite3ExprListDup((sqlite3 *)pDup_local,pNew->pOrderBy,pRet._4_4_);
    pEVar1[1].a[0].zSpan = (char *)pEVar2;
    *(u8 *)&pEVar1->a[0].pExpr = pNew->op;
    *(Select ***)(pEVar1 + 2) = pp;
    pEVar1[1].a[0].sortOrder = '\0';
    *(undefined3 *)&pEVar1[1].a[0].field_0x19 = 0;
    pEVar1[1].a[0].u = (anon_union_4_2_6146edf4_for_u)0x0;
    pEVar4 = sqlite3ExprDup((sqlite3 *)pDup_local,pNew->pLimit,pRet._4_4_);
    pEVar1[2].a[0].pExpr = pEVar4;
    pEVar4 = sqlite3ExprDup((sqlite3 *)pDup_local,pNew->pOffset,pRet._4_4_);
    pEVar1[2].a[0].zName = (char *)pEVar4;
    *(undefined4 *)&pEVar1->a[0].zName = 0;
    *(undefined4 *)((long)&pEVar1->a[0].zName + 4) = 0;
    *(u32 *)((long)&pEVar1->a[0].pExpr + 4) = pNew->selFlags & 0xffffffdf;
    *(undefined4 *)&pEVar1->a[0].zSpan = 0xffffffff;
    *(undefined4 *)((long)&pEVar1->a[0].zSpan + 4) = 0xffffffff;
    *(LogEst *)((long)&pEVar1->a[0].pExpr + 2) = pNew->nSelectRow;
    pWVar5 = withDup((sqlite3 *)pDup_local,pNew->pWith);
    pEVar1[2].a[0].zSpan = (char *)pWVar5;
    p->pEList = pEVar1;
    p = (Select *)&pEVar1[1].a[0].sortOrder;
    pNew = pNew->pPrior;
    pp = (Select **)pEVar1;
  }
  return pNext;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->pOffset = sqlite3ExprDup(db, p->pOffset, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = withDup(db, p->pWith);
    sqlite3SelectSetName(pNew, p->zSelName);
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}